

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::EventLoop::EventLoop(EventLoop *this,EventPort *port)

{
  TaskSet *pTVar1;
  
  this->port = port;
  this->running = false;
  this->lastRunnableState = false;
  this->head = (Event *)0x0;
  this->tail = &this->head;
  this->depthFirstInsertPoint = &this->head;
  pTVar1 = (TaskSet *)operator_new(0x28);
  pTVar1->errorHandler = (ErrorHandler *)&_::LoggingErrorHandler::instance;
  (pTVar1->tasks).ptr.disposer = (Disposer *)0x0;
  (pTVar1->tasks).ptr.ptr = (Task *)0x0;
  (pTVar1->emptyFulfiller).ptr.disposer = (Disposer *)0x0;
  (pTVar1->emptyFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->daemons).disposer = (Disposer *)&_::HeapDisposer<kj::TaskSet>::instance;
  (this->daemons).ptr = pTVar1;
  return;
}

Assistant:

EventLoop::EventLoop(EventPort& port)
    : port(port),
      daemons(kj::heap<TaskSet>(_::LoggingErrorHandler::instance)) {}